

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptions
          (DescriptorBuilder *this,FileOptions *orig_options,FileDescriptor *descriptor)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_48;
  
  lVar1 = **(long **)(descriptor + 8);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,lVar1,(*(long **)(descriptor + 8))[1] + lVar1);
  std::__cxx11::string::append((char *)&local_48);
  AllocateOptionsImpl<google::protobuf::FileDescriptor>
            (this,&local_48,*(string **)descriptor,orig_options,descriptor);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptions(const FileOptions& orig_options,
                                        FileDescriptor* descriptor) {
  // We add the dummy token so that LookupSymbol does the right thing.
  AllocateOptionsImpl(descriptor->package() + ".dummy", descriptor->name(),
                      orig_options, descriptor);
}